

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inverse_mglsa_digital_filter.cc
# Opt level: O0

bool __thiscall
sptk::InverseMglsaDigitalFilter::Run
          (InverseMglsaDigitalFilter *this,
          vector<double,_std::allocator<double>_> *filter_coefficients,double filter_input,
          double *filter_output,Buffer *buffer)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __first;
  size_type sVar1;
  const_iterator cVar2;
  const_iterator cVar3;
  iterator iVar4;
  const_reference pvVar5;
  reference pvVar6;
  long in_RCX;
  double *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> in_RDI;
  double in_XMM0_Qa;
  double dVar7;
  double dVar8;
  int j_3;
  int j_2;
  double y_1;
  int j_1;
  int j;
  double y;
  double *d;
  int i;
  double x;
  double beta;
  double *b;
  double gained_input;
  MlsaDigitalFilter *in_stack_00000068;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff28;
  double *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  size_type in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  int iVar9;
  undefined4 in_stack_ffffffffffffff54;
  int iVar10;
  int local_94;
  double local_90;
  bool local_1;
  
  if ((((((ulong)in_RDI._M_current[0xb] & 1) == 0) ||
       (sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar1 != (long)(*(int *)(in_RDI._M_current + 1) + 1))) || (in_RDX == (double *)0x0)) ||
     (in_RCX == 0)) {
    local_1 = false;
  }
  else if (*(int *)((long)in_RDI._M_current + 0xc) == 0) {
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RCX + 0x20));
    if (sVar1 != (long)(*(int *)(in_RDI._M_current + 1) + 1)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
    }
    cVar2 = std::vector<double,_std::allocator<double>_>::begin
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff28);
    cVar3 = std::vector<double,_std::allocator<double>_>::end
                      ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff28);
    iVar4 = _GLOBAL__N_1::std::vector<double,_std::allocator<double>_>::begin
                      (in_stack_ffffffffffffff28);
    std::
    transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::negate<double>>
              (cVar2._M_current,cVar3._M_current,iVar4._M_current);
    local_1 = MlsaDigitalFilter::Run
                        (in_stack_00000068,(vector<double,_std::allocator<double>_> *)gained_input,
                         (double)b,(double *)beta,(Buffer *)x);
  }
  else {
    sVar1 = std::vector<double,_std::allocator<double>_>::size
                      ((vector<double,_std::allocator<double>_> *)(in_RCX + 8));
    if (sVar1 != (long)((*(int *)(in_RDI._M_current + 1) + 1) *
                       *(int *)((long)in_RDI._M_current + 0xc))) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff48);
      _GLOBAL__N_1::std::vector<double,_std::allocator<double>_>::begin(in_stack_ffffffffffffff28);
      _GLOBAL__N_1::std::vector<double,_std::allocator<double>_>::end(in_stack_ffffffffffffff28);
      __first._M_current._4_4_ = in_stack_ffffffffffffff44;
      __first._M_current._0_4_ = in_stack_ffffffffffffff40;
      std::
      fill<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double>
                (__first,in_RDI,in_stack_ffffffffffffff30);
    }
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    local_90 = exp(-*pvVar5);
    local_90 = in_XMM0_Qa * local_90;
    if (*(int *)(in_RDI._M_current + 1) == 0) {
      *in_RDX = local_90;
      local_1 = true;
    }
    else {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,1);
      dVar7 = -in_RDI._M_current[2] * in_RDI._M_current[2] + 1.0;
      for (local_94 = 0; local_94 < *(int *)((long)in_RDI._M_current + 0xc); local_94 = local_94 + 1
          ) {
        pvVar6 = _GLOBAL__N_1::std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(in_RCX + 8),
                            (long)((*(int *)(in_RDI._M_current + 1) + 1) * local_94));
        if (((ulong)in_RDI._M_current[3] & 1) == 0) {
          dVar8 = *pvVar6 * *pvVar5;
          for (iVar9 = 1; iVar9 < *(int *)(in_RDI._M_current + 1); iVar9 = iVar9 + 1) {
            pvVar6[iVar9] =
                 in_RDI._M_current[2] * (pvVar6[iVar9 + 1] - pvVar6[iVar9 + -1]) + pvVar6[iVar9];
            dVar8 = pvVar6[iVar9] * pvVar5[iVar9] + dVar8;
          }
          for (iVar9 = *(int *)(in_RDI._M_current + 1); 0 < iVar9; iVar9 = iVar9 + -1) {
            pvVar6[iVar9] = pvVar6[iVar9 + -1];
          }
          *pvVar6 = in_RDI._M_current[2] * *pvVar6 + dVar7 * local_90;
        }
        else {
          dVar8 = dVar7 * *pvVar6;
          pvVar6[*(int *)(in_RDI._M_current + 1)] =
               pvVar5[*(int *)(in_RDI._M_current + 1) + -1] * local_90 +
               in_RDI._M_current[2] * pvVar6[*(int *)(in_RDI._M_current + 1) + -1];
          iVar9 = *(int *)(in_RDI._M_current + 1);
          while (iVar10 = iVar9 + -1, 0 < iVar10) {
            pvVar6[iVar10] =
                 pvVar5[iVar9 + -2] * local_90 +
                 in_RDI._M_current[2] * (pvVar6[iVar9 + -2] - pvVar6[iVar9]) + pvVar6[iVar10];
            iVar9 = iVar10;
          }
          for (iVar9 = 0; iVar9 < *(int *)(in_RDI._M_current + 1); iVar9 = iVar9 + 1) {
            pvVar6[iVar9] = pvVar6[iVar9 + 1];
          }
        }
        local_90 = dVar8 + local_90;
      }
      *in_RDX = local_90;
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool InverseMglsaDigitalFilter::Run(
    const std::vector<double>& filter_coefficients, double filter_input,
    double* filter_output, InverseMglsaDigitalFilter::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ ||
      filter_coefficients.size() !=
          static_cast<std::size_t>(num_filter_order_ + 1) ||
      NULL == filter_output || NULL == buffer) {
    return false;
  }

  // Use inverse MLSA filter.
  if (0 == num_stage_) {
    if (buffer->inverse_filter_coefficients_.size() !=
        static_cast<std::size_t>(num_filter_order_ + 1)) {
      buffer->inverse_filter_coefficients_.resize(num_filter_order_ + 1);
    }
    std::transform(filter_coefficients.begin(), filter_coefficients.end(),
                   buffer->inverse_filter_coefficients_.begin(),
                   std::negate<double>());
    return mlsa_digital_filter_.Run(buffer->inverse_filter_coefficients_,
                                    filter_input, filter_output,
                                    &buffer->mlsa_digital_filter_buffer_);
  }

  // Prepare memories.
  if (buffer->signals_.size() !=
      static_cast<std::size_t>((num_filter_order_ + 1) * num_stage_)) {
    buffer->signals_.resize((num_filter_order_ + 1) * num_stage_);
    std::fill(buffer->signals_.begin(), buffer->signals_.end(), 0.0);
  }

  const double gained_input(filter_input * std::exp(-filter_coefficients[0]));
  if (0 == num_filter_order_) {
    *filter_output = gained_input;
    return true;
  }

  const double* b(&(filter_coefficients[1]));
  const double beta(1.0 - alpha_ * alpha_);
  double x(gained_input);

  for (int i(0); i < num_stage_; ++i) {
    double* d(&buffer->signals_[(num_filter_order_ + 1) * i]);
    if (transposition_) {
      const double y(x + beta * d[0]);
      d[num_filter_order_] =
          b[num_filter_order_ - 1] * x + alpha_ * d[num_filter_order_ - 1];
      for (int j(num_filter_order_ - 1); 0 < j; --j) {
        d[j] += b[j - 1] * x + alpha_ * (d[j - 1] - d[j + 1]);
      }

      for (int j(0); j < num_filter_order_; ++j) {
        d[j] = d[j + 1];
      }

      x = y;
    } else {
      double y(d[0] * b[0]);
      for (int j(1); j < num_filter_order_; ++j) {
        d[j] += alpha_ * (d[j + 1] - d[j - 1]);
        y += d[j] * b[j];
      }
      y += x;

      for (int j(num_filter_order_); 0 < j; --j) {
        d[j] = d[j - 1];
      }
      d[0] = alpha_ * d[0] + beta * x;

      x = y;
    }
  }

  *filter_output = x;

  return true;
}